

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O3

void filemgr_set_compaction_state(filemgr *old_file,filemgr *new_file,file_status_t status)

{
  pthread_spinlock_t *__lock;
  
  if (old_file != (filemgr *)0x0) {
    __lock = &old_file->lock;
    pthread_spin_lock(__lock);
    if (new_file == (filemgr *)0x0) {
      free(old_file->new_filename);
      old_file->new_filename = (char *)0x0;
      LOCK();
      (old_file->status).super___atomic_base<unsigned_char>._M_i = status;
      UNLOCK();
    }
    else {
      assign_new_filename(old_file,new_file->filename);
      LOCK();
      (old_file->status).super___atomic_base<unsigned_char>._M_i = status;
      UNLOCK();
      pthread_spin_unlock(__lock);
      __lock = &new_file->lock;
      pthread_spin_lock(__lock);
      assign_old_filename(new_file,old_file->filename);
    }
    pthread_spin_unlock(__lock);
    return;
  }
  return;
}

Assistant:

void filemgr_set_compaction_state(struct filemgr *old_file,
                                  struct filemgr *new_file,
                                  file_status_t status)
{
    if (old_file) {
        spin_lock(&old_file->lock);
        assign_new_filename(old_file, new_file ? new_file->filename : NULL);
        atomic_store_uint8_t(&old_file->status, status);
        spin_unlock(&old_file->lock);

        if (new_file) {
            spin_lock(&new_file->lock);
            assign_old_filename(new_file, old_file->filename);
            spin_unlock(&new_file->lock);
        }
    }
}